

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBaseGL.cpp
# Opt level: O2

void __thiscall
Diligent::TextureBaseGL::TextureBaseGL
          (TextureBaseGL *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceGLImpl *pDeviceGL,
          TextureDesc *TexDesc,GLenum BindTarget,TextureData *pInitData,bool bIsDeviceInternal)

{
  RefCntAutoPtr<Diligent::IBuffer> *pRVar1;
  USAGE UVar2;
  GLenum GVar3;
  string *Args_1;
  string msg;
  string msg_1;
  string StagingBuffName;
  
  TextureBase<Diligent::EngineGLImplTraits>::TextureBase
            (&this->super_TextureBase<Diligent::EngineGLImplTraits>,pRefCounters,TexViewObjAllocator
             ,pDeviceGL,TexDesc,bIsDeviceInternal);
  (this->super_AsyncWritableResource).m_PendingMemoryBarriers = MEMORY_BARRIER_NONE;
  (this->super_TextureBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00a583f0;
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::GLObjWrapper
            (&this->m_GlTexture,TexDesc->Usage != USAGE_STAGING,(GLTextureCreateReleaseHelper)0x0);
  (this->m_pPBO).m_pObject = (IBuffer *)0x0;
  pRVar1 = &this->m_pPBO;
  this->m_BindTarget = BindTarget;
  GVar3 = TexFormatToGLInternalTexFormat
                    ((this->super_TextureBase<Diligent::EngineGLImplTraits>).
                     super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                     .m_Desc.Format,
                     (this->super_TextureBase<Diligent::EngineGLImplTraits>).
                     super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                     .m_Desc.BindFlags);
  this->m_GLTexFormat = GVar3;
  if (GVar3 == 0) {
    FormatString<char[27]>(&msg,(char (*) [27])"Unsupported texture format");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"TextureBaseGL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x42);
    std::__cxx11::string::~string((string *)&msg);
  }
  UVar2 = TexDesc->Usage;
  if (pInitData == (TextureData *)0x0 && UVar2 == USAGE_IMMUTABLE) {
    LogError<true,char[66]>
              (false,"TextureBaseGL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x44,(char (*) [66])
                     "Immutable textures must be initialized with data at creation time");
    UVar2 = TexDesc->Usage;
  }
  if (UVar2 == USAGE_STAGING) {
    msg._M_dataplus._M_p = (pointer)0x0;
    msg._M_string_length = 0;
    msg.field_2._M_allocated_capacity._0_4_ = 0;
    msg.field_2._M_local_buf[4] = '\x01';
    msg.field_2._M_local_buf[5] = '\0';
    msg.field_2._M_allocated_capacity._6_2_ = 0;
    msg.field_2._8_4_ = 0;
    std::__cxx11::string::string
              ((string *)&StagingBuffName,"Internal staging buffer of texture \'",
               (allocator *)&msg_1);
    std::__cxx11::string::append((char *)&StagingBuffName);
    std::__cxx11::string::push_back((char)&StagingBuffName);
    msg._M_dataplus = StagingBuffName._M_dataplus;
    msg._M_string_length =
         GetStagingTextureDataSize
                   (&(this->super_TextureBase<Diligent::EngineGLImplTraits>).
                     super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                     .m_Desc,4);
    msg.field_2._M_local_buf[4] = '\x03';
    msg.field_2._M_local_buf[5] = TexDesc->CPUAccessFlags;
    msg_1._M_dataplus._M_p = (pointer)pRVar1->m_pObject;
    Args_1 = &msg_1;
    msg_1._M_string_length = (size_type)pRVar1;
    RenderDeviceGLImpl::CreateBuffer
              (pDeviceGL,(BufferDesc *)&msg,(BufferData *)0x0,(IBuffer **)Args_1);
    RefCntAutoPtr<Diligent::IBuffer>::DoublePtrHelper<Diligent::IBuffer>::~DoublePtrHelper
              ((DoublePtrHelper<Diligent::IBuffer> *)&msg_1);
    if (pRVar1->m_pObject == (IBuffer *)0x0) {
      FormatString<char[26],char[7]>
                (&msg_1,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pPBO",
                 (char (*) [7])Args_1);
      DebugAssertionFailed
                (msg_1._M_dataplus._M_p,"TextureBaseGL",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x53);
      std::__cxx11::string::~string((string *)&msg_1);
    }
    std::__cxx11::string::~string((string *)&StagingBuffName);
  }
  return;
}

Assistant:

TextureBaseGL::TextureBaseGL(IReferenceCounters*        pRefCounters,
                             FixedBlockMemoryAllocator& TexViewObjAllocator,
                             RenderDeviceGLImpl*        pDeviceGL,
                             const TextureDesc&         TexDesc,
                             GLenum                     BindTarget,
                             const TextureData*         pInitData /*= nullptr*/,
                             bool                       bIsDeviceInternal /*= false*/) :
    // clang-format off
    TTextureBase
    {
        pRefCounters,
        TexViewObjAllocator,
        pDeviceGL,
        TexDesc,
        bIsDeviceInternal
    },
    m_GlTexture     {TexDesc.Usage != USAGE_STAGING},
    m_BindTarget    {BindTarget },
    m_GLTexFormat   {TexFormatToGLInternalTexFormat(m_Desc.Format, m_Desc.BindFlags)}
    //m_uiMapTarget(0)
// clang-format on
{
    VERIFY(m_GLTexFormat != 0, "Unsupported texture format");
    if (TexDesc.Usage == USAGE_IMMUTABLE && pInitData == nullptr)
        LOG_ERROR_AND_THROW("Immutable textures must be initialized with data at creation time");

    if (TexDesc.Usage == USAGE_STAGING)
    {
        BufferDesc  StagingBufferDesc;
        std::string StagingBuffName = "Internal staging buffer of texture '";
        StagingBuffName += m_Desc.Name;
        StagingBuffName += '\'';
        StagingBufferDesc.Name = StagingBuffName.c_str();

        StagingBufferDesc.Size           = GetStagingTextureDataSize(m_Desc, PBOOffsetAlignment);
        StagingBufferDesc.Usage          = USAGE_STAGING;
        StagingBufferDesc.CPUAccessFlags = TexDesc.CPUAccessFlags;

        pDeviceGL->CreateBuffer(StagingBufferDesc, nullptr, &m_pPBO);
        VERIFY_EXPR(m_pPBO);
    }
}